

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O1

void __thiscall Restaurant::Restaurant(Restaurant *this,Restaurant *other)

{
  pointer *pppTVar1;
  pointer *pppBVar2;
  pointer ppTVar3;
  Table *other_00;
  iterator __position;
  pointer ppBVar4;
  iterator __position_00;
  vector<BaseAction*,std::allocator<BaseAction*>> *this_00;
  int iVar5;
  Table *this_01;
  undefined4 extraout_var;
  pointer ppBVar6;
  pointer ppTVar7;
  Table *tempTable;
  Table *local_60;
  vector<BaseAction*,std::allocator<BaseAction*>> *local_58;
  vector<Table*,std::allocator<Table*>> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  vector<Dish,_std::allocator<Dish>_> *local_38;
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_00111d90;
  this->open = other->open;
  this->nextCustomerId = other->nextCustomerId;
  local_50 = (vector<Table*,std::allocator<Table*>> *)&this->tables;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Dish,_std::allocator<Dish>_>::vector(&this->menu,&other->menu);
  local_58 = (vector<BaseAction*,std::allocator<BaseAction*>> *)&this->actionsLog;
  local_40 = &this->newMsg;
  local_48 = &(this->newMsg).field_2;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->newMsg)._M_dataplus._M_p = (pointer)local_48;
  local_38 = &this->menu;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  ppTVar3 = (other->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar7 = (other->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 = local_58, ppTVar7 != ppTVar3;
      ppTVar7 = ppTVar7 + 1) {
    other_00 = *ppTVar7;
    this_01 = (Table *)operator_new(0x40);
    Table::Table(this_01,other_00);
    __position._M_current =
         (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_60 = this_01;
    if (__position._M_current ==
        (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Table*,std::allocator<Table*>>::_M_realloc_insert<Table*const&>
                (local_50,__position,&local_60);
    }
    else {
      *__position._M_current = this_01;
      pppTVar1 = &(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  ppBVar6 = (other->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppBVar4 = (other->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar6 != ppBVar4) {
    do {
      iVar5 = (*(*ppBVar6)->_vptr_BaseAction[2])();
      local_60 = (Table *)CONCAT44(extraout_var,iVar5);
      __position_00._M_current =
           (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<BaseAction*,std::allocator<BaseAction*>>::_M_realloc_insert<BaseAction*>
                  (this_00,__position_00,(BaseAction **)&local_60);
      }
      else {
        *__position_00._M_current = (BaseAction *)local_60;
        pppBVar2 = &(this->actionsLog).
                    super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppBVar2 = *pppBVar2 + 1;
      }
      ppBVar6 = ppBVar6 + 1;
    } while (ppBVar6 != ppBVar4);
  }
  return;
}

Assistant:

Restaurant::Restaurant(const Restaurant &other) :open(other.open), nextCustomerId(other.nextCustomerId),  tables(), menu(other.menu), actionsLog(), newMsg("")
{
    for (auto table : other.tables) {
        auto * tempTable = new Table(*table);
        tables.push_back(tempTable);
    }
    for (auto j : other.actionsLog) {
        actionsLog.push_back(j->clone());
    }
}